

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Color * __thiscall
scene::World::shade(Color *__return_storage_ptr__,World *this,Computation *comp,int recursion_depth)

{
  bool bVar1;
  const_reference ppLVar2;
  int i;
  ulong __n;
  World *this_00;
  double rhs;
  Color reflected;
  shared_ptr<material::Material> mat;
  Color refracted;
  Color local_b8;
  Color local_a0;
  undefined1 local_88 [88];
  
  image::Color::Color(__return_storage_ptr__,0.0,0.0,0.0);
  for (__n = 0; __n < (ulong)((long)(this->m_lights).
                                    super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_lights).
                                    super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    ppLVar2 = std::vector<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>::at
                        (&this->m_lights,__n);
    bVar1 = shadow(this,*ppLVar2,&comp->m_over_point);
    if (!bVar1) {
      ppLVar2 = std::vector<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>::at
                          (&this->m_lights,__n);
      (*(*ppLVar2)->_vptr_Light[1])(&local_a0,*ppLVar2,comp);
      image::operator+=(__return_storage_ptr__,&local_a0);
    }
  }
  if (recursion_depth < 5) {
    reflection(&local_a0,this,comp,recursion_depth);
    refraction((Color *)(local_88 + 0x10),this,comp,recursion_depth);
    this_00 = (World *)local_88;
    std::__shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               &(comp->m_object->material).
                super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>);
    if ((*(double *)(local_88._0_8_ + 0x28) <= 0.0) || (*(double *)(local_88._0_8_ + 0x30) <= 0.0))
    {
      image::operator+(&local_a0,(Color *)(local_88 + 0x10));
      image::operator+=(__return_storage_ptr__,&local_b8);
    }
    else {
      rhs = schlick(this_00,comp);
      image::operator*((Color *)(local_88 + 0x40),&local_a0,rhs);
      image::operator*((Color *)(local_88 + 0x28),(Color *)(local_88 + 0x10),1.0 - rhs);
      image::operator+((Color *)(local_88 + 0x40),(Color *)(local_88 + 0x28));
      image::operator+=(__return_storage_ptr__,&local_b8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  }
  geometry::primitive::Primitive::color(&local_b8,comp->m_object,&comp->m_point);
  image::hadamard_product(&this->m_ambient,&local_b8);
  image::operator*(&local_a0,(Color *)(local_88 + 0x10),
                   ((comp->m_object->material).
                    super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   ambient);
  image::operator+=(__return_storage_ptr__,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

image::Color scene::World::shade(const core::Computation &comp, int recursion_depth) const
{
    image::Color ret{0, 0, 0};

    // surface
    for (int i = 0; i < m_lights.size(); i++)
    {
	bool shadowed = shadow(m_lights.at(i), comp.over_point());
	if (!shadowed)
	    ret += m_lights.at(i)->lighting(comp);
    }

    // reflection and refraction
    if (recursion_depth < 5)
    {
	image::Color reflected = reflection(comp, recursion_depth);
	image::Color refracted = refraction(comp, recursion_depth);

	std::shared_ptr<material::Material> mat = comp.object()->material;
	if (mat->reflective > 0 && mat->transparency > 0)
	{
	    double reflectance = schlick(comp);
	    ret += reflected * reflectance + refracted * (1 - reflectance);
	}
	else
	    ret += reflected + refracted;
    }

    // ambient
    ret += image::hadamard_product(m_ambient, comp.object()->color(comp.point())) * comp.object()->material->ambient;

    return ret;
}